

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void new_localvar(LexState *ls,TString *name,int n)

{
  FuncState *fs_00;
  int iVar1;
  FuncState *fs;
  int n_local;
  TString *name_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  if (200 < (int)((uint)fs_00->nactvar + n + 1)) {
    errorlimit(fs_00,200,"local variables");
  }
  iVar1 = registerlocalvar(ls,name);
  fs_00->actvar[(int)((uint)fs_00->nactvar + n)] = (unsigned_short)iVar1;
  return;
}

Assistant:

static void new_localvar(LexState*ls,TString*name,int n){
FuncState*fs=ls->fs;
luaY_checklimit(fs,fs->nactvar+n+1,200,"local variables");
fs->actvar[fs->nactvar+n]=cast(unsigned short,registerlocalvar(ls,name));
}